

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O3

FGLROptions * __thiscall
level_info_t::GetOptData<FGLROptions>(level_info_t *this,FName *id,bool create)

{
  FGLROptions *this_00;
  Node *pNVar1;
  Node *pNVar2;
  FName local_1c;
  
  pNVar1 = (this->optdata).Nodes + ((this->optdata).Size - 1 & id->Index);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key.Index == id->Index) {
      return (FGLROptions *)(pNVar2->Pair).Value.Ptr;
    }
  }
  if (create) {
    this_00 = (FGLROptions *)operator_new(0x48);
    FGLROptions::FGLROptions(this_00);
    local_1c = (FName)id->Index;
    pNVar1 = TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
             ::GetNode(&this->optdata,&local_1c);
    (pNVar1->Pair).Value.Ptr = (FOptionalMapinfoData *)this_00;
    return this_00;
  }
  return (FGLROptions *)0x0;
}

Assistant:

T *GetOptData(FName id, bool create = true)
	{
		FOptionalMapinfoDataPtr *pdat = optdata.CheckKey(id);
		
		if (pdat != NULL)
		{
			return static_cast<T*>(pdat->Ptr);
		}
		else if (create)
		{
			T *newobj = new T;
			optdata[id].Ptr = newobj;
			return newobj;
		}
		else return NULL;
	}